

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

bool duckdb::VectorCastHelpers::TemplatedDecimalCast<unsigned_short,long,duckdb::TryCastToDecimal>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters,uint8_t width,
               uint8_t scale)

{
  CastParameters *in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  undefined4 in_R8D;
  VectorDecimalCastData input;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 uVar1;
  uint8_t scale_p;
  uint8_t width_p;
  undefined1 local_38;
  
  uVar1 = (undefined2)in_R8D;
  scale_p = (uint8_t)((uint)in_R8D >> 0x10);
  width_p = (uint8_t)((uint)in_R8D >> 0x18);
  VectorDecimalCastData::VectorDecimalCastData
            ((VectorDecimalCastData *)in_RSI,in_RDX,in_RCX,width_p,scale_p);
  UnaryExecutor::
  GenericExecute<unsigned_short,long,duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>>
            (in_RSI,in_RDX,(idx_t)in_RCX,
             (void *)CONCAT17(width_p,CONCAT16(scale_p,CONCAT24(uVar1,in_stack_ffffffffffffff98))),
             false);
  return (bool)(local_38 & 1);
}

Assistant:

static bool TemplatedDecimalCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters,
	                                 uint8_t width, uint8_t scale) {
		VectorDecimalCastData input(result, parameters, width, scale);
		UnaryExecutor::GenericExecute<SRC, T, VectorDecimalCastOperator<OP>>(source, result, count, (void *)&input,
		                                                                     parameters.error_message);
		return input.vector_cast_data.all_converted;
	}